

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveConditional.cpp
# Opt level: O3

bool __thiscall CDirectiveConditional::evaluate(CDirectiveConditional *this)

{
  ConditionType CVar1;
  bool bVar2;
  char *text;
  int64_t value;
  long local_10;
  
  local_10 = 0;
  if (((this->expression).expression.
       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) ||
     (bVar2 = Expression::evaluateInteger<long>(&this->expression,&local_10), bVar2)) {
    CVar1 = this->type;
    if (CVar1 == IFNDEF) {
      return (bool)(((this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    defined ^ 1);
    }
    if (CVar1 == IFDEF) {
      return ((this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->defined;
    }
    if (CVar1 == IF) {
      return local_10 != 0;
    }
    text = "Invalid conditional type";
  }
  else {
    text = "Invalid conditional expression";
  }
  Logger::queueError<>(Error,text);
  return false;
}

Assistant:

bool CDirectiveConditional::evaluate()
{
	int64_t value = 0;
	if (expression.isLoaded())
	{
		if (!expression.evaluateInteger(value))
		{
			Logger::queueError(Logger::Error, "Invalid conditional expression");
			return false;
		}
	}

	switch (type)
	{
	case ConditionType::IF:
		return value != 0;
	case ConditionType::IFDEF:
		return label->isDefined();
	case ConditionType::IFNDEF:
		return !label->isDefined();
	default:
		break;
	}
			
	Logger::queueError(Logger::Error, "Invalid conditional type");
	return false;
}